

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
* __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
::child(btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
        *this,int i)

{
  template_ElementType<3L> *ppbVar1;
  int i_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *this_local;
  
  ppbVar1 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
            ::GetField<3l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                            *)this);
  return ppbVar1[i];
}

Assistant:

btree_node *child(int i) const { return GetField<3>()[i]; }